

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  stbi__uint32 sVar2;
  uint uVar3;
  stbi__png p;
  
  p.s = s;
  iVar1 = stbi__png_info_raw(&p,(int *)0x0,(int *)0x0,(int *)0x0);
  if (iVar1 == 0) {
LAB_00188762:
    sVar2 = stbi__get32be(s);
    if (sVar2 == 0x38425053) {
      iVar1 = stbi__get16be(s);
      if (iVar1 == 1) {
        stbi__skip(s,6);
        uVar3 = stbi__get16be(s);
        if (uVar3 < 0x11) {
          stbi__get32be(s);
          stbi__get32be(s);
          iVar1 = stbi__get16be(s);
          if (iVar1 == 0x10) goto LAB_0018874a;
        }
      }
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar1 = 0;
  }
  else {
    if (p.depth != 0x10) {
      (p.s)->img_buffer = (p.s)->img_buffer_original;
      (p.s)->img_buffer_end = (p.s)->img_buffer_original_end;
      goto LAB_00188762;
    }
LAB_0018874a:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   return 0;
}